

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O1

bool __thiscall MiddleVal::operator>=(MiddleVal *this,MiddleVal *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  iVar2 = std::__cxx11::string::compare((char *)this);
  dVar5 = this->dVal;
  iVar1 = this->iVal;
  iVar3 = std::__cxx11::string::compare((char *)t);
  if (iVar3 == 0) {
    dVar4 = t->dVal;
  }
  else {
    dVar4 = (double)t->iVal;
  }
  if (iVar2 != 0) {
    dVar5 = (double)iVar1;
  }
  return dVar4 <= dVar5;
}

Assistant:

bool MiddleVal::operator>=(MiddleVal t) {
    double a,b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    return a>=b;
}